

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O3

SRes SzReadHeader(CSzArEx *p,CSzData *sd,ILookInStream *inStream,ISzAlloc *allocMain,
                 ISzAlloc *allocTemp)

{
  ulong *puVar1;
  Byte BVar2;
  ulong uVar3;
  Byte *pBVar4;
  int iVar5;
  UInt32 UVar6;
  uint uVar7;
  size_t *psVar8;
  UInt32 *pUVar9;
  UInt64 *pUVar10;
  ulong uVar11;
  ulong uVar12;
  CSzArEx *tempBufs_00;
  uint uVar13;
  CSzArEx *pCVar14;
  byte *pbVar15;
  size_t sVar16;
  CSzData *sd2;
  CSzBitUi64s *p_00;
  UInt32 numTempBufs;
  int __result__;
  int iVar17;
  long lVar18;
  Byte *pBVar19;
  ulong uVar20;
  bool bVar21;
  uint local_1dc;
  ulong local_1d8;
  UInt32 numFiles;
  undefined4 local_1cc;
  ulong local_1c8;
  CSzBitUi32s *local_1c0;
  UInt64 type_2;
  uint local_1ac;
  undefined8 local_1a8;
  Byte *local_1a0;
  ulong local_198;
  UInt64 type;
  Byte *local_188;
  Byte *local_180;
  byte *local_178;
  Byte *local_170;
  uint local_164;
  undefined8 local_160;
  UInt32 index;
  CSzArEx *local_150;
  CSubStreamInfo local_148;
  UInt64 size;
  UInt64 type_1;
  UInt64 *pUStack_100;
  Byte *local_f8;
  UInt32 *pUStack_f0;
  size_t *local_e8;
  UInt32 *pUStack_e0;
  UInt32 *local_d8;
  Byte *pBStack_d0;
  UInt64 *local_c8;
  Byte *pBStack_c0;
  CBuf tempBufs [8];
  
  lVar18 = 0;
  tempBufs_00 = (CSzArEx *)allocMain;
  do {
    Buf_Init((CBuf *)((long)&tempBufs[0].data + lVar18));
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0x80);
  numFiles = 0;
  local_148.sdSizes.Size = 0;
  local_148.sdCRCs.Data = (Byte *)0x0;
  local_148.sdNumSubStreams.Size = 0;
  local_148.sdSizes.Data = (Byte *)0x0;
  local_148.NumTotalSubStreams = 0;
  local_148.NumSubDigests = 0;
  local_148.sdNumSubStreams.Data = (Byte *)0x0;
  local_148.sdCRCs.Size = 0;
  iVar5 = ReadNumber(sd,&type);
  if (iVar5 == 0) {
    if (type == 2) {
      iVar5 = ReadNumber(sd,&type_1);
      if (iVar5 == 0) {
        while (type_1 != 0) {
          iVar5 = SkipData(sd);
          if ((iVar5 != 0) || (iVar5 = ReadNumber(sd,&type_1), iVar5 != 0)) goto LAB_007312f3;
        }
        iVar5 = ReadNumber(sd,&type);
        if (iVar5 == 0) goto LAB_007313b1;
      }
    }
    else {
LAB_007313b1:
      numTempBufs = 0;
      if (type == 3) {
        local_c8 = (UInt64 *)0x0;
        pBStack_c0 = (Byte *)0x0;
        local_d8 = (UInt32 *)0x0;
        pBStack_d0 = (Byte *)0x0;
        local_e8 = (size_t *)0x0;
        pUStack_e0 = (UInt32 *)0x0;
        local_f8 = (Byte *)0x0;
        pUStack_f0 = (UInt32 *)0x0;
        type_1 = 0;
        pUStack_100 = (UInt64 *)0x0;
        tempBufs_00 = (CSzArEx *)0x0;
        iVar5 = SzReadAndDecodePackedStreams
                          (inStream,sd,tempBufs,8,p->startPosAfterHeader,(CSzAr *)&type_1,allocTemp)
        ;
        numTempBufs = type_1._4_4_;
        SzAr_Free((CSzAr *)&type_1,allocTemp);
        if ((iVar5 != 0) || (iVar5 = ReadNumber(sd,&type), iVar5 != 0)) goto LAB_007312f3;
      }
      if (type == 4) {
        tempBufs_00 = (CSzArEx *)tempBufs;
        iVar5 = SzReadStreamsInfo(&p->db,sd,0x40000000,(CBuf *)tempBufs_00,numTempBufs,&p->dataPos,
                                  &local_148,allocMain);
        if (iVar5 != 0) goto LAB_007312f3;
        p->dataPos = p->dataPos + p->startPosAfterHeader;
        iVar5 = ReadNumber(sd,&type);
        if (iVar5 != 0) goto LAB_007312f3;
      }
      if (type == 0) {
        iVar5 = 0;
      }
      else if (type == 5) {
        iVar5 = SzReadNumber32(sd,&numFiles);
        if (iVar5 == 0) {
          p->NumFiles = numFiles;
          iVar5 = ReadNumber(sd,&type_2);
          if (iVar5 == 0) {
            local_1a8 = (CSzArEx *)0x0;
            local_1c8 = 0;
            local_170 = (Byte *)0x0;
            local_178 = (byte *)0x0;
LAB_0073151c:
            local_1c0 = &p->Attribs;
            while( true ) {
              uVar13 = (uint)type_2;
              uVar20 = CONCAT44(type_2._4_4_,(uint)type_2);
              if (uVar20 == 0) {
                iVar5 = 0x10;
                if ((numFiles - (int)local_1c8 != local_148.NumTotalSubStreams) ||
                   (iVar5 = ReadNumber(sd,&type_1), iVar5 != 0)) goto LAB_007312f3;
                goto LAB_0073194b;
              }
              iVar5 = ReadNumber(sd,&size);
              if (iVar5 != 0) goto LAB_007312f3;
              tempBufs_00 = (CSzArEx *)sd->Size;
              iVar17 = 0x10;
              iVar5 = iVar17;
              if (tempBufs_00 < size) goto LAB_007312f3;
              if (uVar20 < 0x100) break;
switchD_007315a1_caseD_10:
              sd->Size = (long)tempBufs_00 - size;
              sd->Data = sd->Data + size;
LAB_00731678:
              iVar5 = ReadNumber(sd,&type_2);
              if (iVar5 != 0) goto LAB_007312f3;
            }
            switch(uVar13 & 0xff) {
            case 0xe:
              pCVar14 = (CSzArEx *)(ulong)(numFiles + 7 >> 3);
              bVar21 = pCVar14 <= tempBufs_00;
              tempBufs_00 = (CSzArEx *)((long)tempBufs_00 - (long)pCVar14);
              if (bVar21) goto code_r0x007316eb;
              goto LAB_007312f3;
            case 0xf:
              bVar21 = tempBufs_00 < local_1a8;
              tempBufs_00 = (CSzArEx *)((long)tempBufs_00 - (long)local_1a8);
              if (bVar21) goto LAB_007312f3;
              local_170 = sd->Data;
              sd->Size = (size_t)tempBufs_00;
              sd->Data = local_170 + (long)&(local_1a8->db).NumPackStreams;
              goto LAB_007317e8;
            default:
              goto switchD_007315a1_caseD_10;
            case 0x11:
              if (tempBufs_00 == (CSzArEx *)0x0) goto LAB_007312f3;
              sd->Size = (size_t)((long)&tempBufs_00[-1].FileNames + 7);
              pBVar4 = sd->Data;
              pBVar19 = pBVar4 + 1;
              sd->Data = pBVar19;
              BVar2 = *pBVar4;
              local_1c0 = (CSzBitUi32s *)CONCAT71(local_1c0._1_7_,BVar2);
              if (BVar2 == '\0') {
                sVar16 = size - 1;
              }
              else {
                iVar5 = SzReadNumber32(sd,(UInt32 *)&type_1);
                if (iVar5 != 0) goto LAB_007312f3;
                if (numTempBufs <= (uint)type_1) goto LAB_00731ee8;
                pBVar19 = tempBufs[type_1 & 0xffffffff].data;
                sVar16 = tempBufs[type_1 & 0xffffffff].size;
              }
              UVar6 = numFiles;
              iVar5 = iVar17;
              local_1a0 = pBVar19;
              local_150 = p;
              if ((sVar16 & 1) != 0) goto LAB_007312f3;
              uVar20 = (ulong)numFiles;
              psVar8 = (size_t *)(*allocMain->Alloc)(allocMain,(ulong)(numFiles + 1) << 3);
              local_150->FileNameOffsets = psVar8;
              if (psVar8 == (size_t *)0x0) {
                iVar5 = 2;
                goto LAB_007312f3;
              }
              local_198 = uVar20;
              if (sVar16 == 0) {
                *_DAT_000000c8 = 0;
                if (UVar6 != 0) goto LAB_007312f3;
                p = (CSzArEx *)0x0;
                tempBufs_00 = local_150;
              }
              else {
                pBVar19 = (Byte *)(*allocMain->Alloc)(allocMain,sVar16);
                pCVar14 = local_150;
                local_150->FileNames = pBVar19;
                iVar5 = 2;
                if (pBVar19 == (Byte *)0x0) goto LAB_007312f3;
                memcpy(pBVar19,local_1a0,sVar16);
                tempBufs_00 = (CSzArEx *)pCVar14->FileNameOffsets;
                iVar5 = SzReadFileNames(pCVar14->FileNames,sVar16,(UInt32)local_198,
                                        (size_t *)tempBufs_00);
                if (iVar5 != 0) goto LAB_007312f3;
              }
              if ((byte)local_1c0 != '\0') goto LAB_007317d7;
              sd->Size = sd->Size - sVar16;
              sd->Data = sd->Data + sVar16;
              iVar5 = ReadNumber(sd,&type_2);
              goto joined_r0x007318f0;
            case 0x12:
              p_00 = &p->CTime;
              break;
            case 0x14:
              p_00 = &p->MTime;
              break;
            case 0x15:
              (*allocMain->Free)(allocMain,(p->Attribs).Defs);
              (p->Attribs).Defs = (Byte *)0x0;
              (*allocMain->Free)(allocMain,(p->Attribs).Vals);
              (p->Attribs).Vals = (UInt32 *)0x0;
              iVar5 = ReadBitVector(sd,numFiles,&local_1c0->Defs,allocMain);
              if (iVar5 != 0) goto LAB_007312f3;
              if (sd->Size == 0) goto LAB_00731ee8;
              sd->Size = sd->Size - 1;
              pBVar19 = sd->Data;
              sd->Data = pBVar19 + 1;
              sd2 = sd;
              if (*pBVar19 != '\0') {
                iVar5 = SzReadNumber32(sd,&index);
                if (iVar5 != 0) goto LAB_007312f3;
                if (numTempBufs <= index) goto LAB_00731ee8;
                type_1 = (UInt64)tempBufs[index].data;
                pUStack_100 = (UInt64 *)tempBufs[index].size;
                sd2 = (CSzData *)&type_1;
              }
              tempBufs_00 = (CSzArEx *)allocMain;
              iVar5 = ReadUi32s(sd2,numFiles,local_1c0,allocMain);
              if (iVar5 == 0) goto LAB_00731678;
              goto LAB_007312f3;
            }
            tempBufs_00 = (CSzArEx *)tempBufs;
            iVar5 = ReadTime(p_00,numFiles,sd,(CBuf *)tempBufs_00,numTempBufs,allocMain);
            if (iVar5 != 0) goto LAB_007312f3;
            goto LAB_007317d7;
          }
        }
      }
      else {
LAB_00731ee8:
        iVar5 = 0x10;
      }
    }
  }
  goto LAB_007312f3;
LAB_0073194b:
  if (type_1 == 0) {
    type_2._0_4_ = 0;
    pUVar9 = (UInt32 *)(*allocMain->Alloc)(allocMain,(ulong)((p->db).NumFolders + 1) << 2);
    p->FolderToFile = pUVar9;
    iVar5 = 2;
    if (pUVar9 == (UInt32 *)0x0) goto LAB_007312f3;
    if ((ulong)p->NumFiles == 0) {
      p->FileToFolder = (UInt32 *)0x0;
      sVar16 = 8;
    }
    else {
      pUVar9 = (UInt32 *)(*allocMain->Alloc)(allocMain,(ulong)p->NumFiles << 2);
      p->FileToFolder = pUVar9;
      if (pUVar9 == (UInt32 *)0x0) goto LAB_007312f3;
      sVar16 = (ulong)(p->NumFiles + 1) << 3;
    }
    pUVar10 = (UInt64 *)(*allocMain->Alloc)(allocMain,sVar16);
    p->UnpackPositions = pUVar10;
    if (pUVar10 == (UInt64 *)0x0) goto LAB_007312f3;
    uVar13 = p->NumFiles;
    if (uVar13 + 7 < 8) {
      p->IsDirs = (Byte *)0x0;
    }
    else {
      pBVar19 = (Byte *)(*allocMain->Alloc)(allocMain,0);
      p->IsDirs = pBVar19;
      if (pBVar19 == (Byte *)0x0) goto LAB_007312f3;
      uVar13 = p->NumFiles;
    }
    iVar5 = SzBitUi32s_Alloc(&p->CRCs,(ulong)uVar13,allocMain);
    if (iVar5 == 0) {
      local_160 = CONCAT71((int7)((ulong)tempBufs_00 >> 8),1);
      if (local_148.sdCRCs.Size == 0) {
        local_188 = (Byte *)0x0;
        local_180 = (Byte *)0x0;
      }
      else {
        local_148.sdCRCs.Size = local_148.sdCRCs.Size - 1;
        pBVar19 = local_148.sdCRCs.Data + 1;
        if (*local_148.sdCRCs.Data == '\0') {
          local_180 = pBVar19 + (local_148.NumSubDigests + 7 >> 3);
          local_188 = pBVar19;
          local_148.sdCRCs.Data = pBVar19;
        }
        else {
          local_188 = (Byte *)0x0;
          local_160 = 0;
          local_180 = pBVar19;
          local_148.sdCRCs.Data = pBVar19;
        }
      }
      local_198 = (ulong)numFiles;
      if (local_198 == 0) {
        *p->UnpackPositions = 0;
        uVar13 = 0;
        goto LAB_00731f01;
      }
      local_1c0 = (CSzBitUi32s *)CONCAT71(local_1c0._1_7_,0x80);
      local_1d8 = 0;
      local_164 = 0;
      uVar20 = 0;
      local_1cc = 0;
      local_1c8 = local_1c8 & 0xffffffff00000000;
      local_1dc = 0;
      local_1ac = 0;
      pBVar19 = (Byte *)0x0;
      goto LAB_00731b27;
    }
    goto LAB_007312f3;
  }
  iVar5 = SkipData(sd);
  if ((iVar5 != 0) || (iVar5 = ReadNumber(sd,&type_1), iVar5 != 0)) goto LAB_007312f3;
  goto LAB_0073194b;
code_r0x007316eb:
  local_178 = sd->Data;
  sd->Size = (size_t)tempBufs_00;
  sd->Data = local_178 + (long)&pCVar14->db;
  if (numFiles == 0) {
    local_170 = (Byte *)0x0;
    local_1c8 = 0;
  }
  else {
    local_1c8 = 0;
    uVar13 = 0;
    tempBufs_00 = (CSzArEx *)0x0;
    pbVar15 = local_178;
    UVar6 = numFiles;
    do {
      if (uVar13 == 0) {
        tempBufs_00 = (CSzArEx *)(ulong)*pbVar15;
        pbVar15 = pbVar15 + 1;
        uVar13 = 8;
      }
      uVar13 = uVar13 - 1;
      local_1c8 = (ulong)((int)local_1c8 + (uint)(((uint)tempBufs_00 >> (uVar13 & 0x1f) & 1) != 0));
      UVar6 = UVar6 - 1;
    } while (UVar6 != 0);
    local_170 = (Byte *)0x0;
  }
LAB_007317d7:
  local_1a8 = (CSzArEx *)(ulong)((int)local_1c8 + 7U >> 3);
LAB_007317e8:
  iVar5 = ReadNumber(sd,&type_2);
joined_r0x007318f0:
  if (iVar5 != 0) goto LAB_007312f3;
  goto LAB_0073151c;
LAB_00731b27:
  do {
    if ((byte)local_1c0 == '\0') {
      uVar13 = (UInt32)local_1d8 - 1 >> 3;
      p->IsDirs[uVar13] = (Byte)local_1c8;
      (p->CRCs).Defs[uVar13] = (Byte)local_1cc;
      local_1c0 = (CSzBitUi32s *)CONCAT71(local_1c0._1_7_,0x80);
      local_1a8 = (CSzArEx *)((ulong)local_1a8._4_4_ << 0x20);
      local_1cc = 0;
    }
    else {
      local_1a8 = (CSzArEx *)CONCAT44(local_1a8._4_4_,(int)local_1c8);
    }
    p->UnpackPositions[local_1d8] = (UInt64)pBVar19;
    (p->CRCs).Vals[local_1d8] = 0;
    if (local_178 == (byte *)0x0) {
LAB_00731bfe:
      if (local_1dc == 0) {
        iVar17 = 0x10;
        iVar5 = iVar17;
        if ((p->db).NumFolders <= (uint)uVar20) goto LAB_007312f3;
        uVar20 = uVar20 & 0xffffffff;
        while( true ) {
          p->FolderToFile[uVar20] = (UInt32)local_1d8;
          type_2._0_4_ = 1;
          if (local_148.sdNumSubStreams.Data == (Byte *)0x0) break;
          iVar5 = SzReadNumber32(&local_148.sdNumSubStreams,(UInt32 *)&type_2);
          if (iVar5 != 0) goto LAB_007312f3;
          local_1dc = (uint)type_2;
          if ((uint)type_2 != 0) goto LAB_00731c05;
          puVar1 = (p->db).CoderUnpackSizes +
                   ((uint)(p->db).FoToMainUnpackSizeIndex[uVar20] +
                   (p->db).FoToCoderUnpackSizes[uVar20]);
          bVar21 = CARRY8((ulong)pBVar19,*puVar1);
          pBVar19 = pBVar19 + *puVar1;
          iVar5 = iVar17;
          if ((bVar21) || (uVar20 = uVar20 + 1, (p->db).NumFolders <= uVar20)) goto LAB_007312f3;
        }
        local_1dc = 1;
      }
LAB_00731c05:
      p->FileToFolder[local_1d8] = (UInt32)uVar20;
      local_1a0 = pBVar19;
      if (local_178 == (byte *)0x0) {
        local_1c8 = CONCAT44(local_1c8._4_4_,(undefined4)local_1a8);
LAB_00731d34:
        local_1dc = local_1dc - 1;
        if (local_1dc == 0) {
          uVar12 = uVar20 & 0xffffffff;
          uVar11 = (p->db).CoderUnpackSizes
                   [(uint)(p->db).FoToMainUnpackSizeIndex[uVar12] +
                    (p->db).FoToCoderUnpackSizes[uVar12]];
          uVar3 = p->UnpackPositions[p->FolderToFile[uVar12]];
          iVar5 = 0x10;
          if (((long)local_1a0 - uVar3 <= uVar11) &&
             (pBVar19 = (Byte *)(uVar3 + uVar11), !CARRY8(uVar3,uVar11))) {
            if (((uint)type_2 == 1) &&
               ((pBVar4 = (p->db).FolderCRCs.Defs, pBVar4 != (Byte *)0x0 &&
                ((char)(pBVar4[local_1d8 >> 3 & 0x1fffffff] << ((byte)local_1d8 & 7)) < '\0')))) {
              (p->CRCs).Vals[local_1d8] = (p->db).FolderCRCs.Vals[uVar12];
LAB_00731ea3:
              local_1cc = CONCAT31((int3)((uint)local_1cc >> 8),(byte)local_1cc | (byte)local_1c0);
            }
            else if (((char)local_160 == '\0') ||
                    ((local_188 != (Byte *)0x0 && ((char)*local_188 < '\0')))) {
              (p->CRCs).Vals[local_1d8] = *(UInt32 *)(local_180 + (ulong)local_1ac * 4);
              local_1ac = local_1ac + 1;
              goto LAB_00731ea3;
            }
            uVar20 = (ulong)((int)uVar20 + 1);
            goto LAB_00731eb2;
          }
          goto LAB_007312f3;
        }
        iVar5 = ReadNumber(&local_148.sdSizes,&type_1);
        if (iVar5 != 0) goto LAB_007312f3;
        pBVar19 = local_1a0 + type_1;
        if (CARRY8((ulong)local_1a0,type_1)) goto LAB_00731ee8;
        if (((char)local_160 == '\0') || ((local_188 != (Byte *)0x0 && ((char)*local_188 < '\0'))))
        {
          (p->CRCs).Vals[local_1d8] = *(UInt32 *)(local_180 + (ulong)local_1ac * 4);
          local_1ac = local_1ac + 1;
          local_1cc = CONCAT31((int3)((uint)local_1cc >> 8),(byte)local_1cc | (byte)local_1c0);
        }
      }
      else {
        uVar13 = 0x80 >> ((byte)local_1d8 & 7);
        uVar11 = local_1d8 >> 3 & 0x1fffffff;
        local_1c8 = CONCAT44(local_1c8._4_4_,(undefined4)local_1a8);
LAB_00731d1d:
        pBVar19 = local_1a0;
        if ((uVar13 & local_178[uVar11]) == 0) goto LAB_00731d34;
      }
    }
    else {
      uVar11 = local_1d8 >> 3 & 0x1fffffff;
      uVar13 = 0x80 >> (sbyte)(local_1d8 & 0xffffff07);
      if ((uVar13 & local_178[uVar11]) == 0) goto LAB_00731bfe;
      if (local_170 == (Byte *)0x0) {
        uVar7 = (uint)CONCAT71((int7)((local_1d8 & 0xffffff07) >> 8),(byte)local_1c0);
      }
      else {
        uVar7 = (uint)(byte)local_1c0;
        if ((char)(local_170[local_164 >> 3] << ((byte)local_164 & 7)) < '\0') {
          uVar7 = 0;
        }
        local_164 = local_164 + 1;
      }
      local_1c8 = CONCAT44(local_1c8._4_4_,
                           CONCAT31((int3)(uVar7 >> 8),(byte)uVar7 | (byte)local_1a8));
      if (local_1dc != 0) {
        p->FileToFolder[local_1d8] = (uint)uVar20;
        local_1a0 = pBVar19;
        goto LAB_00731d1d;
      }
      p->FileToFolder[local_1d8] = 0xffffffff;
LAB_00731eb2:
      local_1dc = 0;
    }
    uVar13 = (uint)uVar20;
    local_1d8 = local_1d8 + 1;
    local_1c0 = (CSzBitUi32s *)CONCAT71(local_1c0._1_7_,(byte)local_1c0 >> 1);
  } while (local_1d8 != local_198);
  uVar7 = (int)local_198 - 1U >> 3;
  p->IsDirs[uVar7] = (Byte)local_1c8;
  (p->CRCs).Defs[uVar7] = (Byte)local_1cc;
  p->UnpackPositions[local_198] = (UInt64)pBVar19;
  iVar5 = 0x10;
  if (local_1dc == 0) {
LAB_00731f01:
    uVar20 = (ulong)uVar13;
    p->FolderToFile[uVar20] = (UInt32)local_198;
    if (uVar13 < (p->db).NumFolders) {
      do {
        iVar5 = 0x10;
        if (((local_148.sdNumSubStreams.Data == (Byte *)0x0) ||
            (iVar5 = SzReadNumber32(&local_148.sdNumSubStreams,(UInt32 *)&type_2), iVar5 != 0)) ||
           (iVar5 = 0x10, (uint)type_2 != 0)) goto LAB_007312f3;
        p->FolderToFile[uVar20 + 1] = (UInt32)local_198;
        uVar20 = uVar20 + 1;
      } while (uVar20 < (p->db).NumFolders);
    }
    iVar5 = (uint)(local_148.sdNumSubStreams.Size != 0 &&
                  local_148.sdNumSubStreams.Data != (Byte *)0x0) << 4;
  }
LAB_007312f3:
  lVar18 = 0;
  do {
    Buf_Free((CBuf *)((long)&tempBufs[0].data + lVar18),allocTemp);
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0x80);
  if ((iVar5 == 0) && (iVar5 = 0xb, sd->Size == 0)) {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static SRes SzReadHeader(
    CSzArEx *p,
    CSzData *sd,
    ILookInStream *inStream,
    ISzAlloc *allocMain,
    ISzAlloc *allocTemp)
{
  UInt32 i;
  UInt32 numTempBufs = 0;
  SRes res;
  CBuf tempBufs[NUM_ADDITIONAL_STREAMS_MAX];

  for (i = 0; i < NUM_ADDITIONAL_STREAMS_MAX; i++)
    Buf_Init(tempBufs + i);
  
  res = SzReadHeader2(p, sd, inStream,
      tempBufs, &numTempBufs,
      allocMain, allocTemp);
  
  for (i = 0; i < NUM_ADDITIONAL_STREAMS_MAX; i++)
    Buf_Free(tempBufs + i, allocTemp);

  RINOK(res);

  if (sd->Size != 0)
    return SZ_ERROR_FAIL;

  return res;
}